

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O0

Node * adios2::helper::anon_unknown_0::YAMLNode
                 (string *nodeName,Node *upperNode,string *hint,bool isMandatory,value nodeType)

{
  bool bVar1;
  value vVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  string *in_RSI;
  Node *in_RDI;
  byte in_R8B;
  value in_R9D;
  Node *node;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Node *in_stack_fffffffffffffdd0;
  int commRank;
  Node *source;
  string *in_stack_fffffffffffffe10;
  string local_1d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  Node *in_stack_fffffffffffffe58;
  undefined1 local_189 [40];
  undefined1 local_161 [40];
  allocator local_139;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [39];
  undefined1 local_b1 [40];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  undefined1 local_29;
  value local_28;
  byte local_21;
  
  local_21 = in_R8B & 1;
  local_29 = 0;
  source = in_RDI;
  local_28 = in_R9D;
  YAML::Node::operator[]<std::__cxx11::string>(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  if (((local_21 & 1) != 0) && (bVar1 = YAML::Node::operator!((Node *)0x9d65d7), bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"Helper",&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"adiosYAML",&local_89);
    in_stack_fffffffffffffdd0 = (Node *)local_b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_b1 + 1),"YAMLNode",(allocator *)in_stack_fffffffffffffdd0);
    std::operator+((char *)in_RSI,in_RDX);
    std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
    std::operator+(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    Throw<std::invalid_argument>
              (in_stack_fffffffffffffe10,(string *)source,(string *)in_RDI,in_RSI,
               (int)((ulong)in_RDX >> 0x20));
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string((string *)(local_b1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_b1);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  bVar1 = YAML::Node::operator_cast_to_bool((Node *)0x9d68ae);
  if ((bVar1) && (vVar2 = YAML::Node::Type(in_stack_fffffffffffffdd0), vVar2 != local_28)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"Helper",&local_139);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_161;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_161 + 1),"adiosYAML",(allocator *)__lhs);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_189;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_189 + 1),"YAMLNode",(allocator *)__rhs);
    std::operator+((char *)in_RSI,in_RDX);
    commRank = (int)((ulong)in_RDX >> 0x20);
    std::operator+(__lhs,(char *)__rhs);
    std::operator+(__lhs,__rhs);
    Throw<std::invalid_argument>
              (in_stack_fffffffffffffe10,(string *)source,(string *)in_RDI,in_RSI,commRank);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe50);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe10);
    std::__cxx11::string::~string((string *)(local_189 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_189);
    std::__cxx11::string::~string((string *)(local_161 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_161);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  return source;
}

Assistant:

YAML::Node YAMLNode(const std::string nodeName, const YAML::Node &upperNode,
                    const std::string &hint, const bool isMandatory,
                    const YAML::NodeType::value nodeType)
{
    const YAML::Node node = upperNode[nodeName];

    if (isMandatory && !node)
    {
        helper::Throw<std::invalid_argument>(
            "Helper", "adiosYAML", "YAMLNode",
            "no " + nodeName + " node found, (is your node key lower case?), " + hint);
    }
    if (node && node.Type() != nodeType)
    {
        helper::Throw<std::invalid_argument>("Helper", "adiosYAML", "YAMLNode",
                                             "node " + nodeName +
                                                 " is the wrong type, review adios2 "
                                                 "config YAML specs for the node, " +
                                                 hint);
    }
    return node;
}